

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O2

int __thiscall String::compare(String *this,String *other)

{
  byte bVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  
  pcVar2 = operator_cast_to_char_(this);
  pcVar3 = operator_cast_to_char_(other);
  lVar4 = 0;
  while( true ) {
    bVar1 = pcVar2[lVar4];
    if (bVar1 != pcVar3[lVar4]) {
      return (uint)bVar1 - (uint)(byte)pcVar3[lVar4];
    }
    if (bVar1 == 0) break;
    lVar4 = lVar4 + 1;
  }
  return 0;
}

Assistant:

int compare(const String& other) const
  {
    const char* s1 = *this, * s2 = other;
    for(; *s1 == *s2; ++s1, ++s2)
      if(!*s1)
        return 0;
    return (int)*(const uchar*)s1 - *(const uchar*)s2;

  }